

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

bool __thiscall
hgdb::json::Scope<hgdb::json::VarStmt>::operator==
          (Scope<hgdb::json::VarStmt> *this,Scope<hgdb::json::VarStmt> *scope)

{
  __type_conflict2 _Var1;
  __optional_eq_t<unsigned_int,_unsigned_int> _Var2;
  __type_conflict2 local_19;
  Scope<hgdb::json::VarStmt> *scope_local;
  Scope<hgdb::json::VarStmt> *this_local;
  
  _Var1 = std::operator==(&this->filename,&scope->filename);
  local_19 = false;
  if (_Var1) {
    _Var2 = std::operator==(&this->line_num,&scope->line_num);
    local_19 = false;
    if ((_Var2) && (local_19 = false, this->column_num == scope->column_num)) {
      local_19 = std::operator==(&this->condition,&scope->condition);
    }
  }
  return local_19;
}

Assistant:

[[nodiscard]] bool operator==(const Scope<T> &scope) const {
        // notice that we do not compare the inner scopes
        return filename == scope.filename && line_num == scope.line_num &&
               column_num == scope.column_num && condition == scope.condition;
    }